

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall
Js::ByteCodeWriter::NewInnerFunction
          (ByteCodeWriter *this,RegSlot destinationRegister,uint index,RegSlot environmentRegister,
          bool isGenerator,RegSlot homeObjLocation)

{
  code *pcVar1;
  bool bVar2;
  RegSlot value;
  RegSlot instance;
  RegSlot homeObj;
  undefined4 *puVar3;
  bool bVar4;
  OpCode local_28;
  bool success_1;
  bool success;
  OpCode opcode;
  bool hasHomeObj;
  RegSlot homeObjLocation_local;
  bool isGenerator_local;
  RegSlot environmentRegister_local;
  uint index_local;
  RegSlot destinationRegister_local;
  ByteCodeWriter *this_local;
  
  CheckOpen(this);
  bVar4 = homeObjLocation != 0xffffffff;
  value = ConsumeReg(this,destinationRegister);
  instance = ConsumeReg(this,environmentRegister);
  local_28 = NewInnerScFunc;
  if (isGenerator) {
    local_28 = NewInnerScGenFunc;
    if (bVar4) {
      local_28 = NewInnerScGenFuncHomeObj;
    }
  }
  else {
    bVar2 = ParseableFunctionInfo::DoStackNestedFunc
                      (&this->m_functionWrite->super_ParseableFunctionInfo);
    if (bVar2) {
      if (bVar4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x934,"(!hasHomeObj)","!hasHomeObj");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      local_28 = NewInnerStackScFunc;
    }
    else if (bVar4) {
      local_28 = NewInnerScFuncHomeObj;
    }
  }
  bVar2 = OpCodeAttr::HasMultiSizeLayout(local_28);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x93b,"(OpCodeAttr::HasMultiSizeLayout(opcode))",
                                "OpCodeAttr::HasMultiSizeLayout(opcode)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (bVar4) {
    homeObj = ConsumeReg(this,homeObjLocation);
    bVar4 = TryWriteElementSlotI3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                      (this,local_28,value,instance,index,homeObj);
    if (((!bVar4) &&
        (bVar4 = TryWriteElementSlotI3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                           (this,local_28,value,instance,index,homeObj), !bVar4)) &&
       (bVar4 = TryWriteElementSlotI3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                          (this,local_28,value,instance,index,homeObj), !bVar4)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x940,"(success)","success");
      if (!bVar4) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
  }
  else {
    bVar4 = TryWriteElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                      (this,local_28,value,instance,index);
    if (((!bVar4) &&
        (bVar4 = TryWriteElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                           (this,local_28,value,instance,index), !bVar4)) &&
       (bVar4 = TryWriteElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                          (this,local_28,value,instance,index), !bVar4)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x944,"(success)","success");
      if (!bVar4) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
  }
  return;
}

Assistant:

void ByteCodeWriter::NewInnerFunction(RegSlot destinationRegister, uint index, RegSlot environmentRegister, bool isGenerator, RegSlot homeObjLocation)
    {
        CheckOpen();

        bool hasHomeObj = homeObjLocation != Js::Constants::NoRegister;

        destinationRegister = ConsumeReg(destinationRegister);
        environmentRegister = ConsumeReg(environmentRegister);
        OpCode opcode = OpCode::NewInnerScFunc;
        if (isGenerator)
        {
            opcode = hasHomeObj ? OpCode::NewInnerScGenFuncHomeObj : OpCode::NewInnerScGenFunc;
        }
        else if (this->m_functionWrite->DoStackNestedFunc())
        {
            Assert(!hasHomeObj);
            opcode = OpCode::NewInnerStackScFunc;
        }
        else if (hasHomeObj)
        {
            opcode = OpCode::NewInnerScFuncHomeObj;
        }
        Assert(OpCodeAttr::HasMultiSizeLayout(opcode));

        if (hasHomeObj)
        {
            homeObjLocation = ConsumeReg(homeObjLocation);
            MULTISIZE_LAYOUT_WRITE(ElementSlotI3, opcode, destinationRegister, environmentRegister, index, homeObjLocation);
        }
        else
        {
            MULTISIZE_LAYOUT_WRITE(ElementSlot, opcode, destinationRegister, environmentRegister, index);
        }
    }